

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event.cpp
# Opt level: O1

void __thiscall sc_core::sc_event_list::push_back(sc_event_list *this,sc_event_list *el)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  std::vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_>::reserve
            ((vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_> *)this,
             (long)((int)((ulong)(*(long *)(el + 8) - *(long *)el) >> 3) +
                   (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 3)));
  uVar2 = (int)((ulong)(*(long *)(el + 8) - *(long *)el) >> 3) - 1;
  if (-1 < (int)uVar2) {
    lVar3 = (ulong)uVar2 + 1;
    do {
      push_back(this,*(sc_event **)(*(long *)el + -8 + lVar3 * 8));
      lVar4 = lVar3 + -1;
      bVar1 = 0 < lVar3;
      lVar3 = lVar4;
    } while (lVar4 != 0 && bVar1);
  }
  if (*(int *)(el + 0x1c) != 0) {
    *(int *)(el + 0x1c) = *(int *)(el + 0x1c) + -1;
  }
  if ((*(int *)(el + 0x1c) == 0) && (el[0x19] == (sc_event_list)0x1)) {
    if (*(void **)el != (void *)0x0) {
      operator_delete(*(void **)el);
    }
    operator_delete(el);
    return;
  }
  return;
}

Assistant:

void
sc_event_list::push_back( const sc_event_list& el )
{
    m_events.reserve( size() + el.size() );
    for ( int i = el.m_events.size() - 1; i >= 0; --i )
    {
        push_back( *el.m_events[i] );
    }
    el.auto_delete();
}